

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_FeatureTypes_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00745e10 == '\x01') {
    DAT_00745e10 = '\0';
    (*(code *)*_Int64FeatureType_default_instance_)();
  }
  if (DAT_00745e30 == '\x01') {
    DAT_00745e30 = '\0';
    (*(code *)*_DoubleFeatureType_default_instance_)();
  }
  if (DAT_00745e50 == '\x01') {
    DAT_00745e50 = '\0';
    (*(code *)*_StringFeatureType_default_instance_)();
  }
  if (DAT_00745e80 == '\x01') {
    DAT_00745e80 = '\0';
    (*(code *)*_SizeRange_default_instance_)();
  }
  if (DAT_00745eb0 == '\x01') {
    DAT_00745eb0 = '\0';
    (*(code *)*_ImageFeatureType_ImageSize_default_instance_)();
  }
  if (DAT_00745ee8 == '\x01') {
    DAT_00745ee8 = '\0';
    (*(code *)*_ImageFeatureType_EnumeratedImageSizes_default_instance_)();
  }
  if (DAT_00745f18 == '\x01') {
    DAT_00745f18 = '\0';
    (*(code *)*_ImageFeatureType_ImageSizeRange_default_instance_)();
  }
  if (DAT_00745f58 == '\x01') {
    DAT_00745f58 = '\0';
    (*(code *)*_ImageFeatureType_default_instance_)();
  }
  if (DAT_00745f98 == '\x01') {
    DAT_00745f98 = '\0';
    (*(code *)*_ArrayFeatureType_Shape_default_instance_)();
  }
  if (DAT_00745fd0 == '\x01') {
    DAT_00745fd0 = '\0';
    (*(code *)*_ArrayFeatureType_EnumeratedShapes_default_instance_)();
  }
  if (DAT_00746008 == '\x01') {
    DAT_00746008 = '\0';
    (*(code *)*_ArrayFeatureType_ShapeRange_default_instance_)();
  }
  if (DAT_00746058 == '\x01') {
    DAT_00746058 = '\0';
    (*(code *)*_ArrayFeatureType_default_instance_)();
  }
  if (DAT_007460a0 == '\x01') {
    DAT_007460a0 = '\0';
    (*(code *)*_DictionaryFeatureType_default_instance_)();
  }
  if (DAT_007460e0 == '\x01') {
    DAT_007460e0 = '\0';
    (*(code *)*_SequenceFeatureType_default_instance_)();
  }
  if (DAT_00746120 == '\x01') {
    DAT_00746120 = 0;
    (*(code *)*_FeatureType_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Int64FeatureType_default_instance_.Shutdown();
  _DoubleFeatureType_default_instance_.Shutdown();
  _StringFeatureType_default_instance_.Shutdown();
  _SizeRange_default_instance_.Shutdown();
  _ImageFeatureType_ImageSize_default_instance_.Shutdown();
  _ImageFeatureType_EnumeratedImageSizes_default_instance_.Shutdown();
  _ImageFeatureType_ImageSizeRange_default_instance_.Shutdown();
  _ImageFeatureType_default_instance_.Shutdown();
  _ArrayFeatureType_Shape_default_instance_.Shutdown();
  _ArrayFeatureType_EnumeratedShapes_default_instance_.Shutdown();
  _ArrayFeatureType_ShapeRange_default_instance_.Shutdown();
  _ArrayFeatureType_default_instance_.Shutdown();
  _DictionaryFeatureType_default_instance_.Shutdown();
  _SequenceFeatureType_default_instance_.Shutdown();
  _FeatureType_default_instance_.Shutdown();
}